

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall
testing::internal::ExpectationBase::FindUnsatisfiedPrerequisites
          (ExpectationBase *this,ExpectationSet *result)

{
  bool bVar1;
  reference ppEVar2;
  pointer this_00;
  __shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *this_01;
  reference e;
  element_type *local_60;
  ExpectationBase *next;
  _Self local_50;
  const_iterator it;
  ExpectationBase *exp;
  ExpectationBase *local_38;
  undefined1 local_30 [8];
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  expectations;
  ExpectationSet *result_local;
  ExpectationBase *this_local;
  
  expectations.
  super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)result;
  Mutex::AssertHeld((Mutex *)&g_gmock_mutex);
  local_38 = this;
  std::allocator<const_testing::internal::ExpectationBase_*>::allocator
            ((allocator<const_testing::internal::ExpectationBase_*> *)((long)&exp + 7));
  std::
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ::vector((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
            *)local_30,1,&local_38,(allocator_type *)((long)&exp + 7));
  std::allocator<const_testing::internal::ExpectationBase_*>::~allocator
            ((allocator<const_testing::internal::ExpectationBase_*> *)((long)&exp + 7));
  while (bVar1 = std::
                 vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                 ::empty((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                          *)local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppEVar2 = std::
              vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
              ::back((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                      *)local_30);
    it._M_node = (_Base_ptr)*ppEVar2;
    std::
    vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
    ::pop_back((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                *)local_30);
    local_50._M_node = (_Base_ptr)ExpectationSet::begin((ExpectationSet *)&it._M_node[2]._M_left);
    while( true ) {
      next = (ExpectationBase *)ExpectationSet::end((ExpectationSet *)&it._M_node[2]._M_left);
      bVar1 = std::operator!=(&local_50,(_Self *)&next);
      if (!bVar1) break;
      this_00 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->(&local_50);
      this_01 = &Expectation::expectation_base(this_00)->
                 super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
      local_60 = std::__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>::
                 get(this_01);
      bVar1 = IsSatisfied(local_60);
      if (bVar1) {
        if (local_60->call_count_ == 0) {
          std::
          vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
          ::push_back((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                       *)local_30,&local_60);
        }
      }
      else {
        e = std::_Rb_tree_const_iterator<testing::Expectation>::operator*(&local_50);
        ExpectationSet::operator+=
                  ((ExpectationSet *)
                   expectations.
                   super__Vector_base<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,e);
      }
      std::_Rb_tree_const_iterator<testing::Expectation>::operator++(&local_50);
    }
  }
  std::
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ::~vector((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
             *)local_30);
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  ::std::vector<const ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    const ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      const ExpectationBase* next = it->expectation_base().get();

      if (next->IsSatisfied()) {
        // If *it is satisfied and has a call count of 0, some of its
        // pre-requisites may not be satisfied yet.
        if (next->call_count_ == 0) {
          expectations.push_back(next);
        }
      } else {
        // Now that we know next is unsatisfied, we are not so interested
        // in whether its pre-requisites are satisfied.  Therefore we
        // don't iterate into it here.
        *result += *it;
      }
    }
  }
}